

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_map_s.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
estl::
sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
::operator[](sort_map_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_30UL,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_10UL>
             *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  bool bVar1;
  iterator pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  bVar1 = key_is_last_element(this,key);
  if (bVar1) {
    pvVar2 = (this->data_vec_).data_ptr_ + ((this->data_vec_).size_ - 1);
  }
  else {
    pvVar2 = do_find(this,key);
    if (pvVar2 == (this->data_vec_).data_ptr_ + (this->data_vec_).size_) {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      local_78._M_string_length = 0;
      local_78.field_2._M_local_buf[0] = '\0';
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_58,key,&local_78);
      pvVar2 = do_insert_raw(this,&local_58);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_58);
      std::__cxx11::string::~string((string *)&local_78);
    }
  }
  return &pvVar2->second;
}

Assistant:

T& operator[]( const Key& key )
    {
        if (key_is_last_element(key)) {
            return data_vec_.back().second;
        }
        iterator it = do_find(key);
        if (it == end()) {
            it = do_insert_raw({key,T()});
        }
        return it->second;
    }